

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|
          (CharClass<unsigned_char> *__return_storage_ptr__,CharClass<unsigned_char> *this,
          CharClass<unsigned_char> *cc)

{
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *this_00;
  pointer pRVar1;
  pointer pRVar2;
  CharClass<unsigned_char> *pCVar3;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  __last;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  _Var4;
  uchar *puVar5;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  _Var6;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  __first;
  Range<unsigned_char> rj;
  Range<unsigned_char> ri;
  value_type local_58;
  CharClass<unsigned_char> *local_48;
  value_type local_40;
  
  local_48 = __return_storage_ptr__;
  CharClass(__return_storage_ptr__);
  _Var6._M_current =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __first._M_current =
       (cc->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_40._vptr_Range = (_func_int **)&PTR__Range_00199580;
  local_58._vptr_Range = (_func_int **)&PTR__Range_00199580;
  local_40.m_start = '\0';
  local_40.m_end = '\0';
  local_58.m_start = '\0';
  local_58.m_end = '\0';
  __last._M_current =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != __last._M_current) {
    local_40.m_start = (_Var6._M_current)->m_start;
    local_40.m_end = (_Var6._M_current)->m_end;
  }
  if (__first._M_current !=
      (cc->m_ranges).
      super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58.m_start = (__first._M_current)->m_start;
    local_58.m_end = (__first._M_current)->m_end;
  }
  this_00 = &local_48->m_ranges;
  do {
    pCVar3 = local_48;
    if ((_Var6._M_current == __last._M_current) ||
       (pRVar2 = (cc->m_ranges).
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, __first._M_current == pRVar2)) {
      std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
      insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
                ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                  *)this_00,
                 (local_48->m_ranges).
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,_Var6,__last);
      std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
      insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
                ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                  *)this_00,
                 (pCVar3->m_ranges).
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__first,
                 (cc->m_ranges).
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      return pCVar3;
    }
    _Var4._M_current = _Var6._M_current;
    puVar5 = &local_40.m_start;
    if (local_58.m_start < local_40.m_end) {
      if (local_40.m_start < local_58.m_end) {
        if (local_40.m_end < local_58.m_end) {
          if (local_40.m_start < local_58.m_start) {
            local_58.m_start = local_40.m_start;
          }
          _Var6._M_current = _Var6._M_current + 1;
          if (_Var6._M_current != __last._M_current) {
LAB_0011bec1:
            *(undefined2 *)puVar5 = *(undefined2 *)&_Var4._M_current[1].m_start;
          }
        }
        else {
          if (local_58.m_start < local_40.m_start) {
            local_40.m_start = local_58.m_start;
          }
          pRVar1 = __first._M_current + 1;
          _Var4._M_current = __first._M_current;
          puVar5 = &local_58.m_start;
          __first._M_current = pRVar1;
          if (pRVar1 != pRVar2) goto LAB_0011bec1;
        }
      }
      else {
        std::
        vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
        push_back(this_00,&local_58);
        pRVar2 = __first._M_current + 1;
        _Var4._M_current = __first._M_current;
        puVar5 = &local_58.m_start;
        __first._M_current = pRVar2;
        if (pRVar2 != (cc->m_ranges).
                      super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011bec1;
      }
    }
    else {
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      push_back(this_00,&local_40);
      _Var6._M_current = _Var6._M_current + 1;
      if (_Var6._M_current !=
          (this->m_ranges).
          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011bec1;
    }
    __last._M_current =
         (this->m_ranges).
         super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

CharClass<TCHAR> CharClass<TCHAR>::operator|(const CharClass<TCHAR>& cc) const
{
    CharClass<TCHAR> new_class;

    auto i = m_ranges.cbegin();
    auto j = cc.m_ranges.cbegin();

    Range<TCHAR> ri, rj;

    if (i != m_ranges.cend()) ri = *i;
    if (j != cc.m_ranges.cend()) rj = *j;

    while (i != m_ranges.cend() && j != cc.m_ranges.cend())
    {
        if (ri < rj)
        {
            new_class.m_ranges.push_back(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        else if (ri > rj)
        {
            new_class.m_ranges.push_back(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }
        else
        {
            if (ri.end() < rj.end())
            {
                rj = rj.merge(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else
            {
                ri = ri.merge(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
        }
    }

    new_class.m_ranges.insert(new_class.m_ranges.end(), i, m_ranges.cend());
    new_class.m_ranges.insert(new_class.m_ranges.end(), j, cc.m_ranges.cend());

    return new_class;
}